

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O1

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  undefined1 auVar1 [16];
  undefined4 extraout_EAX;
  ulong uVar2;
  size_t outlen;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int vflag;
  secp256k1_scalar diff;
  unsigned_long _zzq_result;
  uchar nonce32 [32];
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_gej gb;
  secp256k1_fe f;
  uchar keydata [64];
  secp256k1_scalar local_228;
  undefined8 local_208;
  secp256k1_scalar *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  secp256k1_rfc6979_hmac_sha256 local_1b8;
  secp256k1_scalar local_168;
  secp256k1_gej local_148;
  secp256k1_fe local_a8;
  uchar local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  secp256k1_scalar_half((secp256k1_scalar *)&local_148,&secp256k1_scalar_one);
  secp256k1_scalar_negate((secp256k1_scalar *)&local_148,(secp256k1_scalar *)&local_148);
  local_228.d[2] = 0;
  local_228.d[3] = 0;
  local_228.d[0] = 1;
  local_228.d[1] = 0;
  iVar3 = 0x101;
  do {
    secp256k1_scalar_add(&local_228,&local_228,&local_228);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  secp256k1_scalar_add(&local_228,&local_228,(secp256k1_scalar *)&local_148);
  if (seed32 == (uchar *)0x0) {
    secp256k1_ge_neg(&ctx->ge_offset,&secp256k1_ge_const_g);
    secp256k1_scalar_add(&ctx->scalar_offset,&secp256k1_scalar_one,&local_228);
    (ctx->proj_blind).n[0] = 1;
    (ctx->proj_blind).n[1] = 0;
    (ctx->proj_blind).n[2] = 0;
    (ctx->proj_blind).n[3] = 0;
    (ctx->proj_blind).n[4] = 0;
    (ctx->proj_blind).magnitude = 1;
    (ctx->proj_blind).normalized = 1;
  }
  else {
    secp256k1_scalar_get_b32(local_78,&ctx->scalar_offset);
    local_58 = *(undefined8 *)seed32;
    uStack_50 = *(undefined8 *)(seed32 + 8);
    local_48 = *(undefined8 *)(seed32 + 0x10);
    uStack_40 = *(undefined8 *)(seed32 + 0x18);
    secp256k1_rfc6979_hmac_sha256_initialize(&local_1b8,local_78,0x40);
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0x18] = '\0';
    local_78[0x19] = '\0';
    local_78[0x1a] = '\0';
    local_78[0x1b] = '\0';
    local_78[0x1c] = '\0';
    local_78[0x1d] = '\0';
    local_78[0x1e] = '\0';
    local_78[0x1f] = '\0';
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    local_148.x.n[0] = 0x4d430001;
    local_148.x.n[2] = 0x40;
    local_148.x.n[3] = 0;
    local_148.x.n[4] = 0;
    local_148.x.magnitude = 0;
    local_148.x.normalized = 0;
    local_208 = 0;
    local_148.x.n[1] = (uint64_t)local_78;
    secp256k1_rfc6979_hmac_sha256_generate(&local_1b8,local_1d8,0);
    secp256k1_fe_impl_set_b32_mod(&local_a8,local_1d8);
    local_a8.magnitude = 1;
    local_a8.normalized = 0;
    secp256k1_fe_verify(&local_a8);
    secp256k1_fe_verify(&local_a8);
    uVar4 = (local_a8.n[4] >> 0x30) * 0x1000003d1 + local_a8.n[0];
    uVar2 = (uVar4 >> 0x34) + local_a8.n[1];
    uVar5 = (uVar2 >> 0x34) + local_a8.n[2];
    uVar6 = (uVar5 >> 0x34) + local_a8.n[3];
    uVar7 = (uVar6 >> 0x34) + (local_a8.n[4] & 0xffffffffffff);
    secp256k1_fe_cmov(&local_a8,&secp256k1_fe_one,
                      (uint)(((uVar4 ^ 0x1000003d0) & uVar2 & uVar5 & uVar6 &
                             (uVar7 ^ 0xf000000000000)) == 0xfffffffffffff ||
                            ((uVar2 | uVar4 | uVar5 | uVar6) & 0xfffffffffffff) == 0 && uVar7 == 0))
    ;
    (ctx->proj_blind).n[4] = local_a8.n[4];
    (ctx->proj_blind).magnitude = local_a8.magnitude;
    (ctx->proj_blind).normalized = local_a8.normalized;
    (ctx->proj_blind).n[2] = local_a8.n[2];
    (ctx->proj_blind).n[3] = local_a8.n[3];
    (ctx->proj_blind).n[0] = local_a8.n[0];
    (ctx->proj_blind).n[1] = local_a8.n[1];
    secp256k1_rfc6979_hmac_sha256_generate(&local_1b8,local_1d8,outlen);
    secp256k1_scalar_set_b32(&local_168,local_1d8,(int *)0x0);
    secp256k1_scalar_verify(&local_168);
    auVar8._0_4_ = -(uint)((uint)local_168.d[0] == 0 && (int)local_168.d[2] == 0);
    auVar8._4_4_ = -(uint)(local_168.d[0]._4_4_ == 0 && local_168.d[2]._4_4_ == 0);
    auVar8._8_4_ = -(uint)((int)local_168.d[1] == 0 && (int)local_168.d[3] == 0);
    auVar8._12_4_ = -(uint)(local_168.d[1]._4_4_ == 0 && local_168.d[3]._4_4_ == 0);
    iVar3 = movmskps(extraout_EAX,auVar8);
    secp256k1_scalar_verify(&secp256k1_scalar_one);
    local_148.x.n[0] = 0x4d430005;
    local_148.x.n[2] = 0x20;
    local_148.x.n[3] = 0;
    local_148.x.n[4] = 0;
    local_148.x.magnitude = 0;
    local_148.x.normalized = 0;
    local_208 = 0;
    uVar2 = (long)(int)(uint)(iVar3 == 0xf) - 1;
    uVar4 = CONCAT44(local_168.d[0]._4_4_,(uint)local_168.d[0]) & uVar2;
    local_168.d[0]._0_4_ = (uint)(iVar3 == 0xf) | (uint)uVar4;
    local_168.d[0]._4_4_ = (int)(uVar4 >> 0x20);
    auVar1._4_4_ = local_168.d[1]._4_4_;
    auVar1._0_4_ = (int)local_168.d[1];
    auVar1._8_4_ = (int)local_168.d[2];
    auVar1._12_4_ = local_168.d[2]._4_4_;
    auVar9._8_4_ = (int)uVar2;
    auVar9._0_8_ = uVar2;
    auVar9._12_4_ = (int)(uVar2 >> 0x20);
    auVar9 = auVar9 & auVar1;
    local_168.d[1]._0_4_ = auVar9._0_4_;
    local_168.d[1]._4_4_ = auVar9._4_4_;
    local_168.d[2]._0_4_ = auVar9._8_4_;
    local_168.d[2]._4_4_ = auVar9._12_4_;
    uVar2 = CONCAT44(local_168.d[3]._4_4_,(int)local_168.d[3]) & uVar2;
    local_168.d[3]._0_4_ = (int)uVar2;
    local_168.d[3]._4_4_ = (int)(uVar2 >> 0x20);
    local_148.x.n[1] = (uint64_t)&local_168;
    secp256k1_scalar_verify(&local_168);
    secp256k1_ecmult_gen(ctx,&local_148,&local_168);
    secp256k1_scalar_negate(&local_168,&local_168);
    secp256k1_scalar_add(&ctx->scalar_offset,&local_168,&local_228);
    secp256k1_ge_set_gej(&ctx->ge_offset,&local_148);
    local_1c8 = (undefined1  [16])0x0;
    local_1d8 = (undefined1  [16])0x0;
    local_168.d[0]._0_4_ = 0;
    local_168.d[0]._4_4_ = 0;
    local_168.d[1]._0_4_ = 0;
    local_168.d[1]._4_4_ = 0;
    local_168.d[2]._0_4_ = 0;
    local_168.d[2]._4_4_ = 0;
    local_168.d[3]._0_4_ = 0;
    local_168.d[3]._4_4_ = 0;
    local_208 = 0x4d430001;
    local_1f8 = 0x20;
    local_1f0 = 0;
    local_1e8 = 0;
    local_1e0 = 0;
    local_200 = &local_168;
    memset(&local_148,0,0x98);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_scalar diff;
    secp256k1_gej gb;
    secp256k1_fe f;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char keydata[64];

    /* Compute the (2^COMB_BITS - 1)/2 term once. */
    secp256k1_ecmult_gen_scalar_diff(&diff);

    if (seed32 == NULL) {
        /* When seed is NULL, reset the final point and blinding value. */
        secp256k1_ge_neg(&ctx->ge_offset, &secp256k1_ge_const_g);
        secp256k1_scalar_add(&ctx->scalar_offset, &secp256k1_scalar_one, &diff);
        ctx->proj_blind = secp256k1_fe_one;
        return;
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(keydata, &ctx->scalar_offset);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    VERIFY_CHECK(seed32 != NULL);
    memcpy(keydata + 32, seed32, 32);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, 64);
    secp256k1_memclear(keydata, sizeof(keydata));

    /* Compute projective blinding factor (cannot be 0). */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_fe_set_b32_mod(&f, nonce32);
    secp256k1_fe_cmov(&f, &secp256k1_fe_one, secp256k1_fe_normalizes_to_zero(&f));
    ctx->proj_blind = f;

    /* For a random blinding value b, set scalar_offset=diff-b, ge_offset=bG */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* The blinding value cannot be zero, as that would mean ge_offset = infinity,
     * which secp256k1_gej_add_ge cannot handle. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    secp256k1_scalar_add(&ctx->scalar_offset, &b, &diff);
    secp256k1_ge_set_gej(&ctx->ge_offset, &gb);

    /* Clean up. */
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
    secp256k1_fe_clear(&f);
    secp256k1_rfc6979_hmac_sha256_clear(&rng);
}